

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O3

ostream * test_detail::print_tuple_impl<std::tuple<char_const&,char_const&>,0ul,1ul>
                    (ostream *stream,undefined8 *t)

{
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
  uStack_18._0_7_ = CONCAT16(*(undefined1 *)t[1],(undefined6)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)((long)&uStack_18 + 6),1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
  uStack_18 = CONCAT17(*(undefined1 *)*t,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)((long)&uStack_18 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
  return stream;
}

Assistant:

std::ostream & print_tuple_impl (std::ostream & stream, const Tuple & t, std::index_sequence<Head, Tail...>)
    {
        stream << "(";
        stream << std::get<Head>(t);
        auto x = {(stream << ", " << std::get<Tail>(t), 0)...};
        static_cast<void>(x);
        stream << ")";

        return stream;
    }